

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O3

int os_execute(lua_State *L)

{
  int iVar1;
  char *__command;
  
  __command = luaL_optlstring(L,1,(char *)0x0,(size_t *)0x0);
  iVar1 = system(__command);
  if (__command != (char *)0x0) {
    iVar1 = luaL_execresult(L,iVar1);
    return iVar1;
  }
  lua_pushboolean(L,iVar1);
  return 1;
}

Assistant:

static int os_execute (lua_State *L) {
  const char *cmd = luaL_optstring(L, 1, NULL);
  int stat = system(cmd);
  if (cmd != NULL)
    return luaL_execresult(L, stat);
  else {
    lua_pushboolean(L, stat);  /* true if there is a shell */
    return 1;
  }
}